

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_changed_ranges.c
# Opt level: O3

_Bool iterator_descend(Iterator *self,uint32_t goal_position)

{
  uint32_t uVar1;
  uint uVar2;
  undefined4 uVar3;
  SubtreeHeapData *pSVar4;
  SubtreeHeapData *pSVar5;
  uint uVar6;
  undefined4 uVar7;
  _Bool _Var8;
  TreeCursorEntry *pTVar9;
  ulong extraout_RAX;
  uint uVar10;
  ulong uVar11;
  undefined8 uVar12;
  uint32_t uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar18;
  ulong uVar17;
  uint32_t uVar19;
  uint32_t uVar20;
  Iterator *self_00;
  uint uVar21;
  Subtree *pSVar22;
  Length result;
  int iStack_e0;
  undefined4 uStack_dc;
  int iStack_cc;
  uint32_t uStack_c8;
  Iterator *local_80;
  undefined4 uStack_64;
  undefined4 uStack_54;
  uint32_t uStack_50;
  
  if (self->in_padding == false) {
    do {
      uVar10 = (self->cursor).stack.size;
      if (uVar10 == 0) {
        __assert_fail("(uint32_t)(&self->cursor.stack)->size - 1 < (&self->cursor.stack)->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/get_changed_ranges.c"
                      ,0xca,"_Bool iterator_descend(Iterator *, uint32_t)");
      }
      uVar2 = uVar10 - 1;
      pTVar9 = (self->cursor).stack.contents;
      pSVar4 = (pTVar9[uVar2].subtree)->ptr;
      if (((ulong)pSVar4 & 1) != 0) goto LAB_00128f3b;
      uVar19 = 0;
      if ((ulong)pSVar4->child_count == 0) goto LAB_00128f3e;
      uVar12._0_4_ = pTVar9[uVar2].position.bytes;
      uVar12._4_4_ = pTVar9[uVar2].position.extent.row;
      pSVar22 = *(Subtree **)&pSVar4->field_17;
      uVar11 = 0;
      uVar20 = pTVar9[uVar2].position.extent.column;
      while( true ) {
        pSVar5 = pSVar22->ptr;
        if (((ulong)pSVar5 & 1) == 0) {
          uVar2 = (pSVar5->padding).bytes;
          uVar6 = (pSVar5->padding).extent.row;
          uVar13 = (pSVar5->padding).extent.column;
        }
        else {
          uVar2 = (uint)((ulong)pSVar5 >> 0x10) & 0xff;
          uVar21 = (uint)((ulong)pSVar5 >> 0x20);
          uVar6 = uVar21 >> 8 & 0xf;
          uVar13 = uVar21 & 0xff;
        }
        uStack_64 = (undefined4)((ulong)uVar12 >> 0x20);
        uVar2 = uVar2 + (int)uVar12;
        uVar14 = CONCAT44(uVar20,uStack_64) + CONCAT44(uVar13,uVar6);
        uVar16 = uVar14 & 0xffffffff | (ulong)uVar13 << 0x20;
        if (uVar6 == 0) {
          uVar16 = uVar14;
        }
        if (((ulong)pSVar5 & 1) == 0) {
          uVar14._0_4_ = (pSVar5->size).bytes;
          uVar14._4_4_ = (pSVar5->size).extent.row;
          uVar13 = (pSVar5->size).extent.column;
          iVar18 = uVar14._4_4_;
        }
        else {
          uVar14 = (ulong)pSVar5 >> 0x18 & 0xff;
          uVar13 = (uint32_t)uVar14;
          iVar18 = 0;
        }
        uVar6 = (int)uVar14 + uVar2;
        uVar16 = uVar16 + CONCAT44(uVar13,iVar18);
        uVar14 = uVar16 & 0xffffffff | (ulong)uVar13 << 0x20;
        if (iVar18 == 0) {
          uVar14 = uVar16;
        }
        uStack_54 = (undefined4)uVar14;
        uStack_50 = (uint32_t)(uVar14 >> 0x20);
        if (goal_position < uVar6) break;
        if (((ulong)pSVar5 & 1) == 0) {
          uVar2 = *(uint *)&pSVar5->field_0x2c >> 2;
        }
        else {
          uVar2 = (uint)pSVar5 >> 3;
        }
        uVar19 = uVar19 + ((uVar2 & 1) == 0);
        uVar11 = uVar11 + 1;
        pSVar22 = pSVar22 + 1;
        uVar12 = CONCAT44(uStack_54,uVar6);
        uVar20 = uStack_50;
        if (pSVar4->child_count == uVar11) goto LAB_00128f3b;
      }
      if (uVar10 == (self->cursor).stack.capacity) {
        uVar6 = uVar10 * 2;
        if (uVar10 * 2 < 9) {
          uVar6 = 8;
        }
        local_80 = (Iterator *)(ulong)uVar6;
        if (uVar10 < uVar6) {
          if (pTVar9 == (TreeCursorEntry *)0x0) {
            pTVar9 = (TreeCursorEntry *)calloc((size_t)local_80,0x20);
            if (pTVar9 == (TreeCursorEntry *)0x0) goto LAB_001291f3;
          }
          else {
            local_80 = (Iterator *)((long)local_80 << 5);
            pTVar9 = (TreeCursorEntry *)realloc(pTVar9,(size_t)local_80);
            if (pTVar9 == (TreeCursorEntry *)0x0) {
              iterator_descend_cold_1();
LAB_001291f3:
              iterator_descend_cold_2();
              if (local_80->in_padding == false) goto LAB_0012923a;
              local_80->in_padding = false;
              _Var8 = iterator_tree_is_visible(local_80);
              pTVar9 = (TreeCursorEntry *)(ulong)_Var8;
              if (!_Var8) goto LAB_0012946a;
              goto LAB_00129228;
            }
            uVar10 = (self->cursor).stack.size;
          }
          (self->cursor).stack.contents = pTVar9;
          (self->cursor).stack.capacity = uVar6;
        }
      }
      (self->cursor).stack.size = uVar10 + 1;
      pTVar9[uVar10].subtree = pSVar22;
      pTVar9[uVar10].position.bytes = (int)uVar12;
      pTVar9[uVar10].position.extent.row = (int)((ulong)uVar12 >> 0x20);
      pTVar9[uVar10].position.extent.column = uVar20;
      pTVar9[uVar10].child_index = (uint32_t)uVar11;
      pTVar9[uVar10].structural_child_index = uVar19;
      _Var8 = iterator_tree_is_visible(self);
    } while (!_Var8);
    if (goal_position < uVar2) {
      self->in_padding = true;
    }
    else {
      self->visible_depth = self->visible_depth + 1;
    }
    uVar19 = 1;
  }
  else {
LAB_00128f3b:
    uVar19 = 0;
  }
LAB_00128f3e:
  return SUB41(uVar19,0);
  while( true ) {
    uVar2 = pTVar9[uVar11].child_index + 1;
    if (uVar2 < pSVar4->child_count) break;
LAB_0012923a:
    do {
      _Var8 = iterator_tree_is_visible(local_80);
      if (_Var8) {
        local_80->visible_depth = local_80->visible_depth - 1;
      }
      pTVar9 = (local_80->cursor).stack.contents;
      uVar19 = (local_80->cursor).stack.size;
      uVar10 = uVar19 - 1;
      uVar11 = (ulong)uVar10;
      (local_80->cursor).stack.size = uVar10;
      if (uVar10 == 0) goto LAB_0012922b;
      pSVar4 = (pTVar9[uVar19 - 2].subtree)->ptr;
    } while (((ulong)pSVar4 & 1) != 0);
  }
  uVar3 = pTVar9[uVar11].position.bytes;
  uVar7 = pTVar9[uVar11].position.extent.row;
  pSVar5 = (pTVar9[uVar11].subtree)->ptr;
  if (((ulong)pSVar5 & 1) == 0) {
    uVar16._0_4_ = (pSVar5->padding).bytes;
    uVar16._4_4_ = (pSVar5->padding).extent.row;
    uVar20 = (pSVar5->padding).extent.column;
    uVar15._0_4_ = (pSVar5->size).bytes;
    uVar15._4_4_ = (pSVar5->size).extent.row;
    uVar13 = (pSVar5->size).extent.column;
    iVar18 = uVar15._4_4_;
  }
  else {
    uVar20 = (uint)((ulong)pSVar5 >> 0x20) & 0xff;
    uVar16 = (ulong)pSVar5 >> 8 & 0xf00000000 | (ulong)((uint)((ulong)pSVar5 >> 0x10) & 0xff);
    uVar15 = (ulong)pSVar5 >> 0x18 & 0xff;
    uVar13 = (uint32_t)uVar15;
    iVar18 = 0;
  }
  uVar1 = pTVar9[uVar11].structural_child_index;
  uStack_dc = (undefined4)(uVar16 >> 0x20);
  uVar17 = CONCAT44(uVar20,uStack_dc) + CONCAT44(uVar13,iVar18);
  uVar14 = uVar17 & 0xffffffff | (ulong)uVar13 << 0x20;
  if (iVar18 == 0) {
    uVar14 = uVar17;
  }
  iStack_cc = (int)uVar14;
  uVar17 = CONCAT44(pTVar9[uVar11].position.extent.column,uVar7) + uVar14;
  uVar14 = uVar17 & 0xffffffff | uVar14 & 0xffffffff00000000;
  if (iStack_cc == 0) {
    uVar14 = uVar17;
  }
  iStack_cc = (int)uVar14;
  uStack_c8 = (uint32_t)(uVar14 >> 0x20);
  if (((ulong)pSVar5 & 1) == 0) {
    uVar6 = *(uint *)&pSVar5->field_0x2c >> 2;
  }
  else {
    uVar6 = (uint)pSVar5 >> 3;
  }
  pSVar22 = (pSVar4->field_17).field_0.children + uVar2;
  if (uVar10 == (local_80->cursor).stack.capacity) {
    uVar21 = 8;
    if (8 < uVar10 * 2) {
      uVar21 = uVar10 * 2;
    }
    if (uVar10 < uVar21) {
      self_00 = (Iterator *)((ulong)uVar21 << 5);
      pTVar9 = (TreeCursorEntry *)realloc(pTVar9,(size_t)self_00);
      if (pTVar9 == (TreeCursorEntry *)0x0) {
        iterator_advance_cold_1();
        uVar11 = extraout_RAX;
        if ((self_00->cursor).stack.size != 0) {
          _Var8 = iterator_tree_is_visible(self_00);
          if ((_Var8) && (self_00->in_padding == false)) {
            self_00->visible_depth = self_00->visible_depth - 1;
          }
          uVar19 = (self_00->cursor).stack.size;
          if (uVar19 == 0) {
            __assert_fail("(uint32_t)(&self->cursor.stack)->size - 1 < (&self->cursor.stack)->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/get_changed_ranges.c"
                          ,0xc0,"void iterator_ascend(Iterator *)");
          }
          uVar10 = uVar19 - 1;
          uVar11 = (ulong)uVar10;
          if ((self_00->cursor).stack.contents[uVar11].child_index != 0) {
            self_00->in_padding = false;
          }
          (self_00->cursor).stack.size = uVar10;
        }
        return SUB81(uVar11,0);
      }
      (local_80->cursor).stack.contents = pTVar9;
      (local_80->cursor).stack.capacity = uVar21;
      uVar10 = (local_80->cursor).stack.size;
      uVar11 = (ulong)uVar10;
      uVar19 = uVar10 + 1;
    }
  }
  (local_80->cursor).stack.size = uVar19;
  pTVar9[uVar11].subtree = pSVar22;
  pTVar9[uVar11].position.bytes = (int)uVar16 + (int)uVar15 + uVar3;
  pTVar9[uVar11].position.extent.row = iStack_cc;
  pTVar9[uVar11].position.extent.column = uStack_c8;
  pTVar9[uVar11].child_index = uVar2;
  pTVar9[uVar11].structural_child_index = uVar1 + ((uVar6 & 1) == 0);
  _Var8 = iterator_tree_is_visible(local_80);
  if (!_Var8) {
LAB_0012946a:
    _Var8 = iterator_descend(local_80,0);
    return _Var8;
  }
  pSVar4 = pSVar22->ptr;
  if (((ulong)pSVar4 & 1) == 0) {
    pTVar9 = (TreeCursorEntry *)(ulong)(pSVar4->padding).bytes;
  }
  else {
    pTVar9 = (TreeCursorEntry *)((ulong)pSVar4 >> 0x10 & 0xff);
  }
  if (pTVar9 == (TreeCursorEntry *)0x0) {
LAB_00129228:
    local_80->visible_depth = local_80->visible_depth + 1;
  }
  else {
    local_80->in_padding = true;
  }
LAB_0012922b:
  return SUB81(pTVar9,0);
}

Assistant:

static bool iterator_descend(Iterator *self, uint32_t goal_position) {
  if (self->in_padding) return false;

  bool did_descend;
  do {
    did_descend = false;
    TreeCursorEntry entry = *array_back(&self->cursor.stack);
    Length position = entry.position;
    uint32_t structural_child_index = 0;
    for (uint32_t i = 0, n = ts_subtree_child_count(*entry.subtree); i < n; i++) {
      const Subtree *child = &entry.subtree->ptr->children[i];
      Length child_left = length_add(position, ts_subtree_padding(*child));
      Length child_right = length_add(child_left, ts_subtree_size(*child));

      if (child_right.bytes > goal_position) {
        array_push(&self->cursor.stack, ((TreeCursorEntry){
          .subtree = child,
          .position = position,
          .child_index = i,
          .structural_child_index = structural_child_index,
        }));

        if (iterator_tree_is_visible(self)) {
          if (child_left.bytes > goal_position) {
            self->in_padding = true;
          } else {
            self->visible_depth++;
          }
          return true;
        }

        did_descend = true;
        break;
      }

      position = child_right;
      if (!ts_subtree_extra(*child)) structural_child_index++;
    }
  } while (did_descend);

  return false;
}